

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ParquetReader::GetGroupOffset(ParquetReader *this,ParquetReaderScanState *state)

{
  _ColumnMetaData__isset _Var1;
  ulong uVar2;
  ParquetRowGroup *pPVar3;
  idx_t iVar4;
  ColumnChunk *column_chunk;
  pointer pCVar5;
  
  pPVar3 = GetGroup(this,state);
  iVar4 = 0xffffffffffffffff;
  for (pCVar5 = (pPVar3->columns).
                super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                .
                super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar5 != (pPVar3->columns).
                super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                .
                super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
    _Var1 = (pCVar5->meta_data).__isset;
    if ((((byte)_Var1 & 4) != 0) &&
       (uVar2 = (pCVar5->meta_data).dictionary_page_offset, uVar2 <= iVar4)) {
      iVar4 = uVar2;
    }
    if ((((byte)_Var1 & 2) != 0) && (uVar2 = (pCVar5->meta_data).index_page_offset, uVar2 <= iVar4))
    {
      iVar4 = uVar2;
    }
    uVar2 = (pCVar5->meta_data).data_page_offset;
    if (uVar2 <= iVar4) {
      iVar4 = uVar2;
    }
  }
  return iVar4;
}

Assistant:

idx_t ParquetReader::GetGroupOffset(ParquetReaderScanState &state) {
	auto &group = GetGroup(state);
	idx_t min_offset = NumericLimits<idx_t>::Maximum();

	for (auto &column_chunk : group.columns) {
		if (column_chunk.meta_data.__isset.dictionary_page_offset) {
			min_offset = MinValue<idx_t>(min_offset, column_chunk.meta_data.dictionary_page_offset);
		}
		if (column_chunk.meta_data.__isset.index_page_offset) {
			min_offset = MinValue<idx_t>(min_offset, column_chunk.meta_data.index_page_offset);
		}
		min_offset = MinValue<idx_t>(min_offset, column_chunk.meta_data.data_page_offset);
	}

	return min_offset;
}